

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void QApplicationPrivate::setActiveWindow(QWidget *act)

{
  QWidget *pQVar1;
  QWidget **ppQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  FocusPolicy FVar6;
  QWidget *pQVar7;
  QGraphicsProxyWidget *pQVar8;
  QStyle *pQVar9;
  long lVar10;
  int i;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QArrayDataPointer<QWidget_*> local_98;
  QArrayDataPointer<QWidget_*> local_78;
  QArrayDataPointer<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (act == (QWidget *)0x0) {
    if (active_window == (QWidget *)0x0) goto LAB_002bd851;
LAB_002bd515:
    bVar4 = true;
    pQVar7 = (QWidget *)0x0;
  }
  else {
    pQVar7 = QWidget::window(act);
    if (active_window == pQVar7) goto LAB_002bd851;
    if (pQVar7 == (QWidget *)0x0) goto LAB_002bd515;
    pQVar8 = QWidget::graphicsProxyWidget(pQVar7);
    if (pQVar8 != (QGraphicsProxyWidget *)0x0) goto LAB_002bd851;
    bVar4 = false;
  }
  local_78.size = 0;
  local_98.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QWidget **)0x0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QWidget **)0x0;
  if (active_window != (QWidget *)0x0) {
    pQVar9 = QApplication::style();
    iVar5 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x17,0,active_window,0);
    if (iVar5 == 0) {
      QList<QWidget_*>::append((QList<QWidget_*> *)&local_98,active_window);
    }
    else {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      QApplication::topLevelWidgets();
      ppQVar2 = local_58.ptr;
      lVar11 = local_58.size << 3;
      for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 8) {
        pQVar1 = *(QWidget **)((long)ppQVar2 + lVar10);
        if (((pQVar1->data->widget_attributes & 0x8000) != 0) &&
           (bVar3 = QWidget::isActiveWindow(pQVar1), bVar3)) {
          QList<QWidget_*>::append((QList<QWidget_*> *)&local_98,pQVar1);
        }
      }
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
    }
  }
  if (focus_widget != (QWidget *)0x0) {
    if ((focus_widget->data->widget_attributes & 0x4000) != 0) {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
    }
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    QFocusEvent::QFocusEvent((QFocusEvent *)&local_58,FocusAboutToChange,ActiveWindowFocusReason);
    QCoreApplication::sendEvent(&focus_widget->super_QObject,(QEvent *)&local_58);
    QFocusEvent::~QFocusEvent((QFocusEvent *)&local_58);
  }
  active_window = pQVar7;
  if (!bVar4) {
    pQVar9 = QApplication::style();
    iVar5 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x17,0,active_window,0);
    if (iVar5 == 0) {
      QList<QWidget_*>::append((QList<QWidget_*> *)&local_78,active_window);
    }
    else {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      QApplication::topLevelWidgets();
      ppQVar2 = local_58.ptr;
      lVar11 = local_58.size << 3;
      for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 8) {
        pQVar7 = *(QWidget **)((long)ppQVar2 + lVar10);
        if (((pQVar7->data->widget_attributes & 0x8000) != 0) &&
           (bVar4 = QWidget::isActiveWindow(pQVar7), bVar4)) {
          QList<QWidget_*>::append((QList<QWidget_*> *)&local_78,pQVar7);
        }
      }
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
    }
  }
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_58,ActivationChange);
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_a8,WindowActivate);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_b8,WindowDeactivate);
  for (uVar12 = 0; uVar12 < (ulong)local_78.size; uVar12 = uVar12 + 1) {
    pQVar7 = local_78.ptr[uVar12];
    QCoreApplication::sendSpontaneousEvent(&pQVar7->super_QObject,(QEvent *)&local_a8);
    QCoreApplication::sendSpontaneousEvent(&pQVar7->super_QObject,(QEvent *)&local_58);
  }
  for (uVar12 = 0; uVar12 < (ulong)local_98.size; uVar12 = uVar12 + 1) {
    pQVar7 = local_98.ptr[uVar12];
    QCoreApplication::sendSpontaneousEvent(&pQVar7->super_QObject,(QEvent *)&local_b8);
    QCoreApplication::sendSpontaneousEvent(&pQVar7->super_QObject,(QEvent *)&local_58);
  }
  bVar4 = inPopupMode();
  if (!bVar4) {
    if ((active_window == (QWidget *)0x0) && (focus_widget != (QWidget *)0x0)) {
LAB_002bd7dc:
      setFocusWidget((QWidget *)0x0,ActiveWindowFocusReason);
    }
    else if (active_window != (QWidget *)0x0) {
      pQVar7 = QWidget::focusWidget(active_window);
      if ((((pQVar7 == (QWidget *)0x0) || ((pQVar7->data->widget_attributes & 0x8000) == 0)) &&
          (pQVar7 = focusNextPrevChild_helper(active_window,true,(bool *)0x0), pQVar1 = focus_widget
          , pQVar7 == (QWidget *)0x0)) &&
         ((focus_widget != (QWidget *)0x0 ||
          (FVar6 = QWidget::focusPolicy(active_window), pQVar7 = active_window, FVar6 == NoFocus))))
      {
        bVar4 = QWidget::isAncestorOf(active_window,pQVar1);
        if (!bVar4) goto LAB_002bd7dc;
      }
      else {
        QWidget::setFocus(pQVar7,ActiveWindowFocusReason);
      }
    }
  }
  QEvent::~QEvent((QEvent *)&local_b8);
  QEvent::~QEvent((QEvent *)&local_a8);
  QEvent::~QEvent((QEvent *)&local_58);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_78);
LAB_002bd851:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::setActiveWindow(QWidget* act)
{
    QWidget* window = act?act->window():nullptr;

    if (QApplicationPrivate::active_window == window)
        return;

#if QT_CONFIG(graphicsview)
    if (window && window->graphicsProxyWidget()) {
        // Activate the proxy's view->viewport() ?
        return;
    }
#endif

    QWidgetList toBeActivated;
    QWidgetList toBeDeactivated;

    if (QApplicationPrivate::active_window) {
        if (QApplication::style()->styleHint(QStyle::SH_Widget_ShareActivation, nullptr, QApplicationPrivate::active_window)) {
            const QWidgetList list = QApplication::topLevelWidgets();
            for (auto *w : list) {
                if (w->isVisible() && w->isActiveWindow())
                    toBeDeactivated.append(w);
            }
        } else {
            toBeDeactivated.append(QApplicationPrivate::active_window);
        }
    }

    if (QApplicationPrivate::focus_widget) {
        if (QApplicationPrivate::focus_widget->testAttribute(Qt::WA_InputMethodEnabled))
            QGuiApplication::inputMethod()->commit();

        QFocusEvent focusAboutToChange(QEvent::FocusAboutToChange, Qt::ActiveWindowFocusReason);
        QCoreApplication::sendEvent(QApplicationPrivate::focus_widget, &focusAboutToChange);
    }

    QApplicationPrivate::active_window = window;

    if (QApplicationPrivate::active_window) {
        if (QApplication::style()->styleHint(QStyle::SH_Widget_ShareActivation, nullptr, QApplicationPrivate::active_window)) {
            const QWidgetList list = QApplication::topLevelWidgets();
            for (auto *w : list) {
                if (w->isVisible() && w->isActiveWindow())
                    toBeActivated.append(w);
            }
        } else {
            toBeActivated.append(QApplicationPrivate::active_window);
        }

    }

    // first the activation/deactivation events
    QEvent activationChange(QEvent::ActivationChange);
    QEvent windowActivate(QEvent::WindowActivate);
    QEvent windowDeactivate(QEvent::WindowDeactivate);

    for (int i = 0; i < toBeActivated.size(); ++i) {
        QWidget *w = toBeActivated.at(i);
        QApplication::sendSpontaneousEvent(w, &windowActivate);
        QApplication::sendSpontaneousEvent(w, &activationChange);
    }

    for(int i = 0; i < toBeDeactivated.size(); ++i) {
        QWidget *w = toBeDeactivated.at(i);
        QApplication::sendSpontaneousEvent(w, &windowDeactivate);
        QApplication::sendSpontaneousEvent(w, &activationChange);
    }

    if (!inPopupMode()) {
        // then focus events
        if (!QApplicationPrivate::active_window && QApplicationPrivate::focus_widget) {
            QApplicationPrivate::setFocusWidget(nullptr, Qt::ActiveWindowFocusReason);
        } else if (QApplicationPrivate::active_window) {
            QWidget *w = QApplicationPrivate::active_window->focusWidget();
            if (w && w->isVisible() /*&& w->focusPolicy() != QWidget::NoFocus*/)
                w->setFocus(Qt::ActiveWindowFocusReason);
            else {
                w = QApplicationPrivate::focusNextPrevChild_helper(QApplicationPrivate::active_window, true);
                if (w) {
                    w->setFocus(Qt::ActiveWindowFocusReason);
                } else {
                    w = QApplicationPrivate::focus_widget;
                    if (!w && QApplicationPrivate::active_window->focusPolicy() != Qt::NoFocus) {
                        QApplicationPrivate::active_window->setFocus(Qt::ActiveWindowFocusReason);
                    } else if (!QApplicationPrivate::active_window->isAncestorOf(w)) {
                        // If the focus widget is not in the activate_window, clear the focus
                        QApplicationPrivate::setFocusWidget(nullptr, Qt::ActiveWindowFocusReason);
                    }
                }
            }
        }
    }
}